

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O1

uint8_t * VP8DecompressAlphaRows(VP8Decoder *dec,VP8Io *io,int row,int num_rows)

{
  byte bVar1;
  int stride;
  byte *pbVar2;
  VP8LDecoder *pVVar3;
  int iVar4;
  uint8_t *puVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint8_t *puVar10;
  ALPHDecoder *pAVar11;
  uint8_t *puVar12;
  long lVar13;
  VP8StatusCode error;
  ulong uVar14;
  int iVar15;
  uint8_t *puVar16;
  
  iVar7 = io->crop_bottom;
  if (iVar7 < num_rows + row || (num_rows < 1 || row < 0)) {
LAB_0012d6d2:
    puVar10 = (uint8_t *)0x0;
  }
  else {
    stride = io->width;
    if (dec->is_alpha_decoded == 0) {
      if (dec->alph_dec == (ALPHDecoder *)0x0) {
        pAVar11 = (ALPHDecoder *)WebPSafeCalloc(1,0xd8);
        dec->alph_dec = pAVar11;
        if (pAVar11 == (ALPHDecoder *)0x0) {
          VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"Alpha decoder initialization failed.");
          goto LAB_0012d6d2;
        }
        puVar10 = (uint8_t *)WebPSafeMalloc((long)io->crop_bottom * (long)io->width,1);
        dec->alpha_plane_mem = puVar10;
        if (puVar10 == (uint8_t *)0x0) {
          iVar6 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"Alpha decoder initialization failed.");
          if (iVar6 != 0) goto LAB_0012d902;
        }
        else {
          dec->alpha_plane = puVar10;
          dec->alpha_prev_line = (uint8_t *)0x0;
LAB_0012d902:
          pAVar11 = dec->alph_dec;
          pbVar2 = dec->alpha_data;
          uVar14 = dec->alpha_data_size;
          puVar10 = dec->alpha_plane;
          VP8FiltersInit();
          pAVar11->output = puVar10;
          iVar6 = io->height;
          pAVar11->width = io->width;
          pAVar11->height = iVar6;
          uVar9 = 0;
          if (1 < uVar14) {
            bVar1 = *pbVar2;
            pAVar11->method = bVar1 & 3;
            pAVar11->filter = *pbVar2 >> 2 & WEBP_FILTER_GRADIENT;
            uVar8 = *pbVar2 >> 4 & 3;
            pAVar11->pre_processing = uVar8;
            if ((((byte)(bVar1 & 3) < 2) && ((byte)uVar8 < 2)) && (*pbVar2 < 0x40)) {
              iVar6 = VP8InitIoInternal(&pAVar11->io,0x210);
              uVar9 = 0;
              if (iVar6 != 0) {
                uVar14 = uVar14 - 1;
                WebPInitCustomIo((WebPDecParams *)0x0,&pAVar11->io);
                (pAVar11->io).opaque = pAVar11;
                iVar6 = io->height;
                (pAVar11->io).width = io->width;
                (pAVar11->io).height = iVar6;
                iVar6 = io->crop_left;
                iVar15 = io->crop_right;
                iVar4 = io->crop_top;
                (pAVar11->io).use_cropping = io->use_cropping;
                (pAVar11->io).crop_left = iVar6;
                (pAVar11->io).crop_right = iVar15;
                (pAVar11->io).crop_top = iVar4;
                (pAVar11->io).crop_bottom = io->crop_bottom;
                if (pAVar11->method == 0) {
                  uVar9 = (uint)((ulong)((long)pAVar11->height * (long)pAVar11->width) <= uVar14);
                }
                else {
                  uVar9 = VP8LDecodeAlphaHeader(pAVar11,pbVar2 + 1,uVar14);
                }
              }
            }
          }
          if (uVar9 != 0) {
            if (dec->alph_dec->pre_processing == 1) {
              num_rows = iVar7 - row;
            }
            else {
              dec->alpha_dithering = 0;
            }
            goto LAB_0012d714;
          }
          pVVar3 = dec->alph_dec->vp8l_dec;
          if (pVVar3 == (VP8LDecoder *)0x0) {
            error = VP8_STATUS_OUT_OF_MEMORY;
          }
          else {
            error = pVVar3->status;
          }
          VP8SetError(dec,error,"Alpha decoder initialization failed.");
        }
LAB_0012da66:
        WebPSafeFree(dec->alpha_plane_mem);
        dec->alpha_plane_mem = (uint8_t *)0x0;
        dec->alpha_plane = (uint8_t *)0x0;
        ALPHDelete(dec->alph_dec);
        dec->alph_dec = (ALPHDecoder *)0x0;
        goto LAB_0012d6d2;
      }
LAB_0012d714:
      pAVar11 = dec->alph_dec;
      iVar7 = (pAVar11->io).crop_bottom;
      if (pAVar11->method == 0) {
        puVar10 = dec->alpha_prev_line;
        if (0 < num_rows) {
          iVar6 = pAVar11->width;
          lVar13 = (long)iVar6;
          puVar16 = dec->alpha_data + (long)(iVar6 * row) + 1;
          puVar5 = dec->alpha_plane + iVar6 * row;
          iVar15 = num_rows;
          do {
            puVar12 = puVar5;
            (*WebPUnfilters[pAVar11->filter])(puVar10,puVar16,puVar12,iVar6);
            puVar16 = puVar16 + lVar13;
            iVar15 = iVar15 + -1;
            puVar5 = puVar12 + lVar13;
            puVar10 = puVar12;
          } while (iVar15 != 0);
          puVar10 = puVar12 + lVar13 + -lVar13;
        }
        dec->alpha_prev_line = puVar10;
      }
      else {
        iVar6 = VP8LDecodeAlphaImageStream(pAVar11,num_rows + row);
        if (iVar6 == 0) goto LAB_0012da66;
      }
      if (iVar7 <= num_rows + row) {
        dec->is_alpha_decoded = 1;
      }
      if (dec->is_alpha_decoded != 0) {
        ALPHDelete(dec->alph_dec);
        dec->alph_dec = (ALPHDecoder *)0x0;
        if ((0 < dec->alpha_dithering) &&
           (iVar7 = WebPDequantizeLevels
                              (dec->alpha_plane +
                               (long)io->crop_left + (long)(io->crop_top * stride),
                               io->crop_right - io->crop_left,io->crop_bottom - io->crop_top,stride,
                               dec->alpha_dithering), iVar7 == 0)) goto LAB_0012da66;
      }
    }
    puVar10 = dec->alpha_plane + stride * row;
  }
  return puVar10;
}

Assistant:

WEBP_NODISCARD const uint8_t* VP8DecompressAlphaRows(VP8Decoder* const dec,
                                                     const VP8Io* const io,
                                                     int row, int num_rows) {
  const int width = io->width;
  const int height = io->crop_bottom;

  assert(dec != NULL && io != NULL);

  if (row < 0 || num_rows <= 0 || row + num_rows > height) {
    return NULL;
  }

  if (!dec->is_alpha_decoded) {
    if (dec->alph_dec == NULL) {    // Initialize decoder.
      dec->alph_dec = ALPHNew();
      if (dec->alph_dec == NULL) {
        VP8SetError(dec, VP8_STATUS_OUT_OF_MEMORY,
                    "Alpha decoder initialization failed.");
        return NULL;
      }
      if (!AllocateAlphaPlane(dec, io)) goto Error;
      if (!ALPHInit(dec->alph_dec, dec->alpha_data, dec->alpha_data_size,
                    io, dec->alpha_plane)) {
        VP8LDecoder* const vp8l_dec = dec->alph_dec->vp8l_dec;
        VP8SetError(dec,
                    (vp8l_dec == NULL) ? VP8_STATUS_OUT_OF_MEMORY
                                       : vp8l_dec->status,
                    "Alpha decoder initialization failed.");
        goto Error;
      }
      // if we allowed use of alpha dithering, check whether it's needed at all
      if (dec->alph_dec->pre_processing != ALPHA_PREPROCESSED_LEVELS) {
        dec->alpha_dithering = 0;    // disable dithering
      } else {
        num_rows = height - row;     // decode everything in one pass
      }
    }

    assert(dec->alph_dec != NULL);
    assert(row + num_rows <= height);
    if (!ALPHDecode(dec, row, num_rows)) goto Error;

    if (dec->is_alpha_decoded) {   // finished?
      ALPHDelete(dec->alph_dec);
      dec->alph_dec = NULL;
      if (dec->alpha_dithering > 0) {
        uint8_t* const alpha = dec->alpha_plane + io->crop_top * width
                             + io->crop_left;
        if (!WebPDequantizeLevels(alpha,
                                  io->crop_right - io->crop_left,
                                  io->crop_bottom - io->crop_top,
                                  width, dec->alpha_dithering)) {
          goto Error;
        }
      }
    }
  }

  // Return a pointer to the current decoded row.
  return dec->alpha_plane + row * width;

 Error:
  WebPDeallocateAlphaMemory(dec);
  return NULL;
}